

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_relation.cpp
# Opt level: O0

void __thiscall
duckdb::DeleteRelation::DeleteRelation
          (DeleteRelation *this,shared_ptr<duckdb::ClientContextWrapper,_true> *context,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *condition_p,string *catalog_name_p,string *schema_name_p,string *table_name_p)

{
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  Relation *in_R8;
  string *in_R9;
  vector<duckdb::ColumnDefinition,_true> *columns;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_ffffffffffffff40;
  Relation *this_00;
  string *in_stack_ffffffffffffff58;
  RelationType type;
  allocator local_51;
  string local_50 [80];
  
  type = (RelationType)((ulong)in_RDX >> 0x38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,anon_var_dwarf_3eb64fd + 9,&local_51);
  Relation::Relation(in_R8,(shared_ptr<duckdb::ClientContextWrapper,_true> *)in_RCX,type,
                     in_stack_ffffffffffffff58);
  ::std::__cxx11::string::~string(local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *in_RDI = &PTR__DeleteRelation_03532ab8;
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195433c);
  columns = (vector<duckdb::ColumnDefinition,_true> *)(in_RDI + 0x10);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr(in_stack_ffffffffffffff40,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)columns);
  this_00 = (Relation *)(in_RDI + 0x11);
  ::std::__cxx11::string::string((string *)this_00,in_RCX);
  ::std::__cxx11::string::string((string *)(in_RDI + 0x15),(string *)in_R8);
  ::std::__cxx11::string::string((string *)(in_RDI + 0x19),in_R9);
  Relation::TryBindRelation(this_00,columns);
  return;
}

Assistant:

DeleteRelation::DeleteRelation(shared_ptr<ClientContextWrapper> &context, unique_ptr<ParsedExpression> condition_p,
                               string catalog_name_p, string schema_name_p, string table_name_p)
    : Relation(context, RelationType::DELETE_RELATION), condition(std::move(condition_p)),
      catalog_name(std::move(catalog_name_p)), schema_name(std::move(schema_name_p)),
      table_name(std::move(table_name_p)) {
	TryBindRelation(columns);
}